

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O2

void t1_destroy(opj_t1_t *t1)

{
  if (t1 != (opj_t1_t *)0x0) {
    mqc_destroy(t1->mqc);
    raw_destroy(t1->raw);
    free(t1->data);
    free(t1->flags);
    free(t1);
    return;
  }
  return;
}

Assistant:

void t1_destroy(opj_t1_t *t1) {
	if(t1) {
		/* destroy MQC and RAW handles */
		mqc_destroy(t1->mqc);
		raw_destroy(t1->raw);
		opj_aligned_free(t1->data);
		opj_aligned_free(t1->flags);
		opj_free(t1);
	}
}